

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOneDimensionalWrapper.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::OneDimensionalWrapper::getLevels
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,OneDimensionalWrapper *this,
          vector<int,_std::allocator<int>_> *point)

{
  pointer piVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  allocator_type local_21;
  
  ::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_21);
  for (uVar3 = 0;
      piVar1 = (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
      uVar3 = uVar3 + 1) {
    iVar2 = getLevel(this,piVar1[uVar3]);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar3] = iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getLevels(std::vector<int> const &point){
        std::vector<int> result(point.size());
        for(size_t i=0; i<point.size(); i++) result[i] = getLevel(point[i]);
        return result;
    }